

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O3

expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::(anonymous_namespace)::XformEvaluator::result_abi_cxx11_
          (expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,void *this)

{
  double *pdVar1;
  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RAX;
  long lVar2;
  undefined8 *puVar3;
  double *local_38;
  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  double local_28;
  double dStack_20;
  
  if (*(long *)((long)this + 8) == 0) {
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    puVar3 = (undefined8 *)((long)this + 0x20);
    for (lVar2 = 0x10; local_30 = in_RAX, lVar2 != 0; lVar2 = lVar2 + -1) {
      *(undefined8 *)
       &(__return_storage_ptr__->contained).
        super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0 = *puVar3;
      puVar3 = puVar3 + 1;
      __return_storage_ptr__ =
           (expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&(__return_storage_ptr__->contained).
                      super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .field_0 + 8);
    }
  }
  else {
    local_38 = &local_28;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,*this,*(long *)((long)this + 8) + *this);
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = false;
    pdVar1 = (__return_storage_ptr__->contained).
             super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .field_0.m_value.m[0] + 2;
    *(double **)
     &(__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0 = pdVar1;
    if (local_38 == &local_28) {
      *pdVar1 = local_28;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.m[0][3] = dStack_20;
    }
    else {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.m[0][0] = (double)local_38;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.m[0][2] = local_28;
    }
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value.m[0][1] = (double)local_30;
  }
  return local_30;
}

Assistant:

nonstd::expected<value::matrix4d, std::string> result() const {
    if (err.empty()) {
      return m;
    }

    return nonstd::make_unexpected(err);
  }